

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_eval.hpp
# Opt level: O1

Boxed_Value __thiscall
chaiscript::eval::Class_AST_Node<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>::
eval_internal(Class_AST_Node<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_> *this,
             Dispatch_State *t_ss)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  int iVar2;
  Dispatch_State *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Boxed_Value BVar3;
  Boxed_Value local_60;
  string local_50;
  undefined1 local_30 [16];
  
  chaiscript::detail::Dispatch_Engine::new_scope((in_RDX->m_stack_holder)._M_data);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"_current_class_name","");
  chaiscript::detail::const_var_impl<std::__cxx11::string>
            ((detail *)&local_60,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             (((t_ss[2].m_conversions.m_conversions._M_data)->m_mutex)._M_impl._M_rwlock.__align +
             0x10));
  chaiscript::detail::Dispatch_State::add_object(in_RDX,&local_50,&local_60);
  if (local_60.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_60.m_data.
               super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>::eval
            ((AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_> *)
             local_30,*(Dispatch_State **)
                       ((long)&((t_ss[2].m_conversions.m_conversions._M_data)->m_mutex)._M_impl.
                               _M_rwlock + 8));
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_30._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_30._8_8_);
  }
  if (void_var()::v == '\0') {
    iVar2 = __cxa_guard_acquire(&void_var()::v);
    if (iVar2 != 0) {
      Boxed_Value::Boxed_Value<chaiscript::Boxed_Value::Void_Type,void>
                (&void_var::v,(Void_Type *)&local_50,false);
      __cxa_atexit(Boxed_Value::~Boxed_Value,&void_var::v,&__dso_handle);
      __cxa_guard_release(&void_var()::v);
    }
  }
  (this->super_AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>).
  super_AST_Node._vptr_AST_Node =
       (_func_int **)
       void_var::v.m_data.
       super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  _Var1 = void_var::v.m_data.
          super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
   &(this->super_AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>).
    super_AST_Node.identifier =
       void_var::v.m_data.
       super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
       _M_pi;
  if (_Var1._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (_Var1._M_pi)->_M_use_count = (_Var1._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (_Var1._M_pi)->_M_use_count = (_Var1._M_pi)->_M_use_count + 1;
    }
  }
  chaiscript::detail::Dispatch_Engine::pop_scope((in_RDX->m_stack_holder)._M_data);
  BVar3.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  BVar3.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)this;
  return (Boxed_Value)
         BVar3.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Boxed_Value eval_internal(const chaiscript::detail::Dispatch_State &t_ss) const override {
        chaiscript::eval::detail::Scope_Push_Pop spp(t_ss);

        /// \todo do this better
        // put class name in current scope so it can be looked up by the attrs and methods
        t_ss.add_object("_current_class_name", const_var(this->children[0]->text));

        this->children[1]->eval(t_ss);

        return void_var();
      }